

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

int helicsTranslatorGetOption(HelicsTranslator trans,int option)

{
  int iVar1;
  HelicsTranslator pvVar2;
  
  iVar1 = 0;
  pvVar2 = (HelicsTranslator)0x0;
  if ((trans != (HelicsTranslator)0x0) && (*(int *)((long)trans + 4) == -0x4c83cad2)) {
    pvVar2 = trans;
  }
  if (pvVar2 != (HelicsTranslator)0x0) {
    iVar1 = (**(code **)(**(long **)((long)pvVar2 + 8) + 0x18))();
  }
  return iVar1;
}

Assistant:

int helicsTranslatorGetOption(HelicsTranslator trans, int option)
{
    auto* transObj = getTranslatorObj(trans, nullptr);
    if (transObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return transObj->transPtr->getOption(option);
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}